

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::MetadataEncodeTest::DecompressedFrameHook(MetadataEncodeTest *this)

{
  aom_codec_pts_t in_stack_00000490;
  aom_image_t *in_stack_00000498;
  MetadataEncodeTest *in_stack_000004a0;
  
  anon_unknown.dwarf_12f2301::MetadataEncodeTest::DecompressedFrameHook
            (in_stack_000004a0,in_stack_00000498,in_stack_00000490);
  return;
}

Assistant:

void DecompressedFrameHook(const aom_image_t &img,
                             aom_codec_pts_t /*pts*/) override {
    const bool is_key_frame =
        (num_decompressed_frames_ % cfg_.kf_max_dist) == 0;
    ++num_decompressed_frames_;

    ASSERT_NE(img.metadata, nullptr);

    ASSERT_EQ(img.metadata->sz, is_key_frame ? 4 : 2);

    aom_metadata_t *metadata = img.metadata->metadata_array[0];
    ASSERT_EQ(metadata->type, OBU_METADATA_TYPE_ITUT_T35);
    ASSERT_EQ(metadata->insert_flag, AOM_MIF_ANY_FRAME);
    ASSERT_EQ(metadata->sz, kMetadataPayloadSizeT35);
    EXPECT_EQ(
        memcmp(kMetadataPayloadT35, metadata->payload, kMetadataPayloadSizeT35),
        0);

    metadata = img.metadata->metadata_array[1];
    ASSERT_EQ(metadata->type, OBU_METADATA_TYPE_ITUT_T35);
    // AOM_MIF_ANY_FRAME and not AOM_MIF_ANY_FRAME_LAYER_SPECIFIC because the
    // stream does not contain layers.
    ASSERT_EQ(metadata->insert_flag, AOM_MIF_ANY_FRAME);
    ASSERT_EQ(metadata->sz, kMetadataPayloadSizeT35Two);
    EXPECT_EQ(memcmp(kMetadataPayloadT35Two, metadata->payload,
                     kMetadataPayloadSizeT35Two),
              0);

    if (is_key_frame) {
      metadata = img.metadata->metadata_array[2];
      ASSERT_EQ(metadata->type, OBU_METADATA_TYPE_HDR_MDCV);
      ASSERT_EQ(metadata->insert_flag, AOM_MIF_ANY_FRAME);
      ASSERT_EQ(metadata->sz, kMetadataPayloadSizeMdcv);
      EXPECT_EQ(memcmp(kMetadataPayloadMdcv, metadata->payload,
                       kMetadataPayloadSizeMdcv),
                0);

      metadata = img.metadata->metadata_array[3];
      ASSERT_EQ(metadata->type, OBU_METADATA_TYPE_HDR_CLL);
      ASSERT_EQ(metadata->insert_flag, AOM_MIF_ANY_FRAME);
      ASSERT_EQ(metadata->sz, kMetadataPayloadSizeCll);
      EXPECT_EQ(memcmp(kMetadataPayloadCll, metadata->payload,
                       kMetadataPayloadSizeCll),
                0);
    }
  }